

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

void xmlXPtrEvalXPointer(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr *ppxVar1;
  xmlChar *name_00;
  bool bVar2;
  xmlChar *name;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt->valueTab == (xmlXPathObjectPtr *)0x0) {
    ppxVar1 = (xmlXPathObjectPtr *)(*xmlMalloc)(0x50);
    ctxt->valueTab = ppxVar1;
    if (ctxt->valueTab == (xmlXPathObjectPtr *)0x0) {
      xmlXPtrErrMemory("allocating evaluation context");
      return;
    }
    ctxt->valueNr = 0;
    ctxt->valueMax = 10;
    ctxt->value = (xmlXPathObjectPtr)0x0;
    ctxt->valueFrame = 0;
  }
  while( true ) {
    bVar2 = true;
    if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
      bVar2 = *ctxt->cur == '\r';
    }
    if (!bVar2) break;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  if (*ctxt->cur == '/') {
    xmlXPathRoot(ctxt);
    xmlXPtrEvalChildSeq(ctxt,(xmlChar *)0x0);
  }
  else {
    name_00 = xmlXPathParseName(ctxt);
    if (name_00 == (xmlChar *)0x0) {
      xmlXPathErr(ctxt,7);
      return;
    }
    if (*ctxt->cur == '(') {
      xmlXPtrEvalFullXPtr(ctxt,name_00);
      return;
    }
    xmlXPtrEvalChildSeq(ctxt,name_00);
  }
  while( true ) {
    bVar2 = true;
    if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
      bVar2 = *ctxt->cur == '\r';
    }
    if (!bVar2) break;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  if (*ctxt->cur != '\0') {
    xmlXPathErr(ctxt,7);
  }
  return;
}

Assistant:

static void
xmlXPtrEvalXPointer(xmlXPathParserContextPtr ctxt) {
    if (ctxt->valueTab == NULL) {
	/* Allocate the value stack */
	ctxt->valueTab = (xmlXPathObjectPtr *)
			 xmlMalloc(10 * sizeof(xmlXPathObjectPtr));
	if (ctxt->valueTab == NULL) {
	    xmlXPtrErrMemory("allocating evaluation context");
	    return;
	}
	ctxt->valueNr = 0;
	ctxt->valueMax = 10;
	ctxt->value = NULL;
	ctxt->valueFrame = 0;
    }
    SKIP_BLANKS;
    if (CUR == '/') {
	xmlXPathRoot(ctxt);
        xmlXPtrEvalChildSeq(ctxt, NULL);
    } else {
	xmlChar *name;

	name = xmlXPathParseName(ctxt);
	if (name == NULL)
	    XP_ERROR(XPATH_EXPR_ERROR);
	if (CUR == '(') {
	    xmlXPtrEvalFullXPtr(ctxt, name);
	    /* Short evaluation */
	    return;
	} else {
	    /* this handle both Bare Names and Child Sequences */
	    xmlXPtrEvalChildSeq(ctxt, name);
	}
    }
    SKIP_BLANKS;
    if (CUR != 0)
	XP_ERROR(XPATH_EXPR_ERROR);
}